

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall
CInput::CJoystick::CJoystick(CJoystick *this,CInput *pInput,int Index,SDL_Joystick *pDelegate)

{
  int iVar1;
  SDL_JoystickID SVar2;
  char *src;
  undefined1 auVar3 [16];
  
  (this->super_IJoystick)._vptr_IJoystick = (_func_int **)&PTR_GetIndex_00206550;
  this->m_pInput = pInput;
  this->m_Index = Index;
  this->m_pDelegate = pDelegate;
  iVar1 = SDL_JoystickNumAxes(pDelegate);
  this->m_NumAxes = iVar1;
  iVar1 = SDL_JoystickNumButtons(pDelegate);
  this->m_NumButtons = iVar1;
  iVar1 = SDL_JoystickNumBalls(pDelegate);
  this->m_NumBalls = iVar1;
  iVar1 = SDL_JoystickNumHats(pDelegate);
  this->m_NumHats = iVar1;
  src = (char *)SDL_JoystickName(pDelegate);
  str_copy(this->m_aName,src,0x40);
  auVar3 = SDL_JoystickGetGUID(pDelegate);
  SDL_JoystickGetGUIDString(auVar3._0_8_,auVar3._8_8_,this->m_aGUID,0x22);
  SVar2 = SDL_JoystickInstanceID(pDelegate);
  this->m_InstanceID = SVar2;
  return;
}

Assistant:

CInput::CJoystick::CJoystick(CInput *pInput, int Index, SDL_Joystick *pDelegate)
{
	m_pInput = pInput;
	m_Index = Index;
	m_pDelegate = pDelegate;
	m_NumAxes = SDL_JoystickNumAxes(pDelegate);
	m_NumButtons = SDL_JoystickNumButtons(pDelegate);
	m_NumBalls = SDL_JoystickNumBalls(pDelegate);
	m_NumHats = SDL_JoystickNumHats(pDelegate);
	str_copy(m_aName, SDL_JoystickName(pDelegate), sizeof(m_aName));
	SDL_JoystickGetGUIDString(SDL_JoystickGetGUID(pDelegate), m_aGUID, sizeof(m_aGUID));
	m_InstanceID = SDL_JoystickInstanceID(pDelegate);
}